

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O3

void bench_keygen_run(void *arg,int iters)

{
  int iVar1;
  long lVar2;
  size_t len;
  uchar pub33 [33];
  secp256k1_pubkey pubkey;
  undefined8 local_a0;
  undefined1 local_98;
  undefined8 local_97;
  undefined8 uStack_8f;
  undefined8 local_87;
  undefined8 uStack_7f;
  undefined1 local_70 [64];
  
  if (0 < iters) {
    do {
      local_a0 = 0x21;
      lVar2 = *arg;
      iVar1 = secp256k1_ec_pubkey_create(lVar2,local_70,(undefined8 *)((long)arg + 0x28));
      if (iVar1 == 0) {
        bench_keygen_run_cold_2();
LAB_00103893:
        bench_keygen_run_cold_1();
        *(undefined8 *)(lVar2 + 0x28) = 0x4847464544434241;
        *(undefined8 *)(lVar2 + 0x30) = 0x504f4e4d4c4b4a49;
        *(undefined8 *)(lVar2 + 0x38) = 0x5857565554535251;
        *(undefined8 *)(lVar2 + 0x40) = 0x605f5e5d5c5b5a59;
        return;
      }
      lVar2 = *arg;
      iVar1 = secp256k1_ec_pubkey_serialize(lVar2,&local_98,&local_a0,local_70,0x102);
      if (iVar1 == 0) goto LAB_00103893;
      *(undefined8 *)((long)arg + 0x38) = local_87;
      *(undefined8 *)((long)arg + 0x40) = uStack_7f;
      *(undefined8 *)((long)arg + 0x28) = local_97;
      *(undefined8 *)((long)arg + 0x30) = uStack_8f;
      iters = iters + -1;
    } while (iters != 0);
  }
  return;
}

Assistant:

static void bench_keygen_run(void *arg, int iters) {
    int i;
    bench_data *data = (bench_data*)arg;

    for (i = 0; i < iters; i++) {
        unsigned char pub33[33];
        size_t len = 33;
        secp256k1_pubkey pubkey;
        CHECK(secp256k1_ec_pubkey_create(data->ctx, &pubkey, data->key));
        CHECK(secp256k1_ec_pubkey_serialize(data->ctx, pub33, &len, &pubkey, SECP256K1_EC_COMPRESSED));
        memcpy(data->key, pub33 + 1, 32);
    }
}